

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O1

void sinf_norm_error(int nrhs,SuperMatrix *X,float *xtrue)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if (0 < nrhs) {
    piVar1 = (int *)X->Store;
    lVar2 = *(long *)(piVar1 + 2);
    iVar4 = 0;
    do {
      dVar6 = NAN;
      if (0 < (long)X->nrow) {
        fVar5 = 0.0;
        lVar3 = 0;
        fVar7 = 0.0;
        do {
          fVar8 = *(float *)((long)(*piVar1 * iVar4) * 4 + lVar2 + lVar3 * 4);
          fVar9 = ABS(fVar8 - xtrue[lVar3]);
          if (fVar5 <= fVar9) {
            fVar5 = fVar9;
          }
          fVar8 = ABS(fVar8);
          if (fVar7 <= fVar8) {
            fVar7 = fVar8;
          }
          lVar3 = lVar3 + 1;
        } while (X->nrow != lVar3);
        dVar6 = (double)(fVar5 / fVar7);
      }
      printf("||X - Xtrue||/||X|| = %e\n",dVar6);
      iVar4 = iVar4 + 1;
    } while (iVar4 != nrhs);
  }
  return;
}

Assistant:

void sinf_norm_error(int nrhs, SuperMatrix *X, float *xtrue)
{
    DNformat *Xstore;
    float err, xnorm;
    float *Xmat, *soln_work;
    int i, j;

    Xstore = X->Store;
    Xmat = Xstore->nzval;

    for (j = 0; j < nrhs; j++) {
      soln_work = &Xmat[j*Xstore->lda];
      err = xnorm = 0.0;
      for (i = 0; i < X->nrow; i++) {
	err = SUPERLU_MAX(err, fabs(soln_work[i] - xtrue[i]));
	xnorm = SUPERLU_MAX(xnorm, fabs(soln_work[i]));
      }
      err = err / xnorm;
      printf("||X - Xtrue||/||X|| = %e\n", err);
    }
}